

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O2

Fl_Type * __thiscall Fl_Widget_Type::make(Fl_Widget_Type *this)

{
  uint uVar1;
  Fl_Type *pFVar2;
  char *n;
  long lVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  Fl_Widget_Type *this_00;
  undefined4 extraout_var_00;
  Fl_Widget *this_01;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  Fl_Type *pFVar10;
  uint uVar11;
  ulong uVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  Fl_Type **ppFVar16;
  undefined4 extraout_var;
  undefined4 extraout_var_01;
  
  ppFVar16 = &Fl_Type::current;
  while( true ) {
    pFVar2 = *ppFVar16;
    if (pFVar2 == (Fl_Type *)0x0) {
      fl_message("Please select a widget");
      return (Fl_Type *)0x0;
    }
    iVar5 = (*pFVar2->_vptr_Fl_Type[0x17])(pFVar2);
    if ((iVar5 != 0) && (iVar5 = (*pFVar2->_vptr_Fl_Type[0x1e])(pFVar2), iVar5 == 0)) break;
    ppFVar16 = &pFVar2->parent;
  }
  pFVar10 = pFVar2;
  if (((force_parent != 0) || (iVar5 = (*pFVar2->_vptr_Fl_Type[0x20])(pFVar2), iVar5 == 0)) &&
     (iVar5 = (*pFVar2->parent->_vptr_Fl_Type[0x17])(), iVar5 != 0)) {
    pFVar10 = pFVar2->parent;
  }
  force_parent = 0;
  uVar4 = (long)*(int *)&(pFVar10[1].prev)->user_data_type_ / 2;
  lVar3 = (long)*(int *)((long)&(pFVar10[1].prev)->user_data_type_ + 4);
  uVar12 = lVar3 / 2;
  if ((int)uVar12 < (int)uVar4) {
    uVar4 = uVar12;
  }
  uVar12 = 0x19;
  if ((int)uVar4 < 0x19) {
    uVar12 = uVar4 & 0xffffffff;
  }
  iVar6 = (*pFVar10->_vptr_Fl_Type[0x21])(pFVar10,uVar4 & 0xffffffff,lVar3 % 2 & 0xffffffff);
  iVar5 = 0;
  iVar13 = 0;
  if (iVar6 == 0) {
    iVar5 = *(int *)&(pFVar10[1].prev)->user_data_;
    iVar13 = *(int *)((long)&(pFVar10[1].prev)->user_data_ + 4);
  }
  iVar6 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x20])(this);
  uVar11 = (uint)uVar12;
  if (iVar6 == 0) {
    if (pFVar2 == pFVar10) {
      uVar7 = iVar5 + uVar11;
      uVar15 = uVar11;
      uVar14 = iVar13 + uVar11;
      uVar9 = uVar11;
    }
    else {
      pFVar2 = pFVar2[1].prev;
      uVar15 = *(uint *)&pFVar2->user_data_type_;
      uVar9 = *(uint *)((long)&pFVar2->user_data_type_ + 4);
      uVar1 = *(uint *)&pFVar2->user_data_;
      uVar14 = *(uint *)((long)&pFVar2->user_data_ + 4);
      uVar7 = uVar1 + uVar15;
      if (iVar5 + *(int *)&(pFVar10[1].prev)->user_data_type_ < (int)(uVar1 + uVar15 + uVar15)) {
        uVar8 = uVar14 + uVar9;
        uVar7 = uVar1;
        uVar14 = uVar11 + iVar13;
        if ((int)(uVar8 + uVar9) <= *(int *)((long)&(pFVar10[1].prev)->user_data_type_ + 4) + iVar13
           ) {
          uVar14 = uVar8;
        }
      }
    }
  }
  else {
    uVar7 = iVar5 + uVar11;
    uVar15 = *(int *)&(pFVar10[1].prev)->user_data_type_ - uVar11;
    uVar14 = iVar13 + uVar11;
    uVar9 = *(int *)((long)&(pFVar10[1].prev)->user_data_type_ + 4) - uVar11;
  }
  if (1 < gridx) {
    uVar7 = uVar7 - (int)uVar7 % gridx;
    uVar15 = ((int)(uVar15 - 1) / gridx + 1) * gridx;
  }
  if (1 < gridy) {
    uVar14 = uVar14 - (int)uVar14 % gridy;
    uVar9 = ((int)(uVar9 - 1) / gridy + 1) * gridy;
  }
  iVar5 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x2a])(this);
  this_00 = (Fl_Widget_Type *)CONCAT44(extraout_var,iVar5);
  if (this->o == (Fl_Widget *)0x0) {
    iVar5 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x29])(this,0,0,100,100);
    this->o = (Fl_Widget *)CONCAT44(extraout_var_00,iVar5);
  }
  (this_00->super_Fl_Type).factory = &this->super_Fl_Type;
  iVar5 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x29])
                    (this,(ulong)uVar7,(ulong)uVar14,(ulong)uVar15,(ulong)uVar9);
  this_01 = (Fl_Widget *)CONCAT44(extraout_var_01,iVar5);
  this_00->o = this_01;
  if (reading_file == 0) {
    n = (this_01->label_).value;
    if (n != (char *)0x0) {
      Fl_Type::label((Fl_Type *)this_00,n);
    }
  }
  else {
    Fl_Widget::label(this_01,(char *)0x0);
  }
  this_00->o->user_data_ = this_00;
  Fl_Type::add((Fl_Type *)this_00,pFVar10);
  redraw(this_00);
  return &this_00->super_Fl_Type;
}

Assistant:

Fl_Type *Fl_Widget_Type::make() {
  // Find the current widget, or widget to copy:
  Fl_Type *qq = Fl_Type::current;
  while (qq && (!qq->is_widget() || qq->is_menu_item())) qq = qq->parent;
  if (!qq) {
    fl_message("Please select a widget");
    return 0;
  }
  Fl_Widget_Type* q = (Fl_Widget_Type*)qq;
  // find the parent widget:
  Fl_Widget_Type* p = q;
  if ((force_parent || !p->is_group()) && p->parent->is_widget())
    p = (Fl_Widget_Type*)(p->parent);
  force_parent = 0;

  // Figure out a border between widget and window:
  int B = p->o->w()/2; if (p->o->h()/2 < B) B = p->o->h()/2; if (B>25) B = 25;

  int ULX,ULY; // parent's origin in window
  if (!p->is_window()) { // if it is a group, add corner
    ULX = p->o->x(); ULY = p->o->y();
  } else {
    ULX = ULY = 0;
  }

  // Figure out a position and size for the widget
  int X,Y,W,H;
  if (is_group()) {	// fill the parent with the widget
    X = ULX+B;
    W = p->o->w()-B;
    Y = ULY+B;
    H = p->o->h()-B;
  } else if (q != p) {	// copy position and size of current widget
    W = q->o->w();
    H = q->o->h();
    X = q->o->x()+W;
    Y = q->o->y();
    if (X+W > ULX+p->o->w()) {
      X = q->o->x();
      Y = q->o->y()+H;
      if (Y+H > ULY+p->o->h()) Y = ULY+B;
    }
  } else {	// just make it small and square...
    X = ULX+B;
    Y = ULY+B;
    W = H = B;
  }

  // satisfy the grid requirements (otherwise it edits really strangely):
  if (gridx>1) {
    X = (X/gridx)*gridx;
    W = ((W-1)/gridx+1)*gridx;
  }
  if (gridy>1) {
    Y = (Y/gridy)*gridy;
    H = ((H-1)/gridy+1)*gridy;
  }

  // Construct the Fl_Type:
  Fl_Widget_Type *t = _make();
  if (!o) o = widget(0,0,100,100); // create template widget
  t->factory = this;
  // Construct the Fl_Widget:
  t->o = widget(X,Y,W,H);
  if (reading_file) t->o->label(0);
  else if (t->o->label()) t->label(t->o->label()); // allow editing
  t->o->user_data((void*)t);
  // Put it in the parent:
  //  ((Fl_Group *)(p->o))->add(t->o); (done by Fl_Type::add())
  // add to browser:
  t->add(p);
  t->redraw();
  return t;
}